

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O3

int mbedtls_ssl_read_record(mbedtls_ssl_context *ssl,uint update_hs_digest)

{
  mbedtls_ssl_handshake_params *pmVar1;
  int *piVar2;
  uchar *__n;
  byte *pbVar3;
  int iVar4;
  int *piVar5;
  uchar *puVar6;
  uint8_t uVar7;
  ushort uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  size_t alloc_len;
  size_t __n_00;
  mbedtls_ssl_hs_buffer *pmVar12;
  byte *pbVar13;
  ulong desired;
  size_t sVar14;
  char *pcVar15;
  char *format;
  ulong uVar16;
  ulong uVar17;
  byte bVar18;
  uint uVar19;
  long lVar20;
  bool bVar21;
  char *in_stack_ffffffffffffff58;
  undefined4 uVar22;
  ulong in_stack_ffffffffffffff60;
  mbedtls_record local_70;
  mbedtls_ssl_hs_buffer *local_40;
  char *local_38;
  
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
             ,0x101a,"=> read record");
  if (ssl->keep_current_message == 0) {
LAB_00208815:
    do {
      uVar17 = ssl->in_hslen;
      if (uVar17 != 0) {
        if (ssl->in_offt != (uchar *)0x0) {
          iVar4 = 0x11de;
          goto LAB_00209609;
        }
        __n_00 = ssl->in_msglen - uVar17;
        if (ssl->in_msglen < uVar17 || __n_00 == 0) {
          ssl->in_msglen = 0;
        }
        else {
          ssl->in_msglen = __n_00;
          memmove(ssl->in_msg,ssl->in_msg + uVar17,__n_00);
          in_stack_ffffffffffffff58 = (char *)ssl->in_msglen;
          mbedtls_debug_print_buf
                    (ssl,4,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                     ,0x11fd,"remaining content in record",ssl->in_msg,
                     (size_t)in_stack_ffffffffffffff58);
        }
        ssl->in_hslen = 0;
LAB_002088ab:
        if (ssl->in_msglen == 0) goto LAB_002088ea;
LAB_002088b5:
        iVar4 = mbedtls_ssl_handle_message_type(ssl);
        if (iVar4 < -0x6480) {
          if ((iVar4 == -0x6680) || (iVar4 == -0x6580)) goto LAB_00208815;
        }
        else {
          if (iVar4 == -0x6480) {
            pmVar1 = ssl->handshake;
            if (pmVar1 != (mbedtls_ssl_handshake_params *)0x0) {
              mbedtls_debug_print_msg
                        (ssl,2,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                         ,0x1101,"=> ssl_buffer_message");
              if (ssl->in_msgtype == 0x16) {
                uVar8 = *(ushort *)(ssl->in_msg + 4) << 8 | *(ushort *)(ssl->in_msg + 4) >> 8;
                uVar11 = ssl->handshake->in_msg_seq;
                uVar10 = (uint)uVar8;
                uVar19 = uVar10 - uVar11;
                if (uVar10 < uVar11) {
                  iVar4 = 0x1114;
LAB_00209609:
                  mbedtls_debug_print_msg
                            (ssl,1,
                             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                             ,iVar4,"should never happen");
                  return -0x6c00;
                }
                uVar22 = (undefined4)((ulong)in_stack_ffffffffffffff58 >> 0x20);
                if (uVar19 < 4) {
                  uVar17 = ssl->in_hslen;
                  local_38 = (char *)(uVar17 - 0xc);
                  in_stack_ffffffffffffff58 = (char *)CONCAT44(uVar22,uVar19);
                  mbedtls_debug_print_msg
                            (ssl,2,
                             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                             ,0x1126,"Buffering HS message with sequence number %u, offset %u ",
                             (ulong)uVar10,in_stack_ffffffffffffff58);
                  pmVar12 = (pmVar1->buffering).hs + uVar19;
                  bVar18 = *(byte *)pmVar12;
                  if ((bVar18 & 1) == 0) {
                    local_40 = pmVar12;
                    iVar4 = ssl_hs_is_proper_fragment(ssl);
                    *(byte *)local_40 = bVar18 & 0xfc | (char)iVar4 * '\x02';
                    if (uVar17 < 0x401) {
                      uVar16 = (pmVar1->buffering).total_bytes_buffered;
                      if (0x8000 < uVar16) {
                        iVar4 = 0x113e;
                        goto LAB_00209609;
                      }
                      desired = uVar17;
                      if (iVar4 != 0) {
                        desired = (((ulong)local_38 >> 3) + uVar17 + 1) -
                                  (ulong)(((ulong)local_38 & 7) == 0);
                      }
                      if (0x8000 - uVar16 < desired) {
                        if (uVar8 != uVar11) {
                          in_stack_ffffffffffffff58 = (char *)0x8000;
                          iVar4 = 0x1152;
                          format = 
                          "Buffering of future message of size %zu would exceed the compile-time limit %zu (already %zu bytes buffered) -- ignore\n"
                          ;
                          pcVar15 = local_38;
                          goto LAB_002095c4;
                        }
                        in_stack_ffffffffffffff58 = (char *)0x8000;
                        mbedtls_debug_print_msg
                                  (ssl,2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                                   ,0x115d,
                                   "Buffering of future message of size %zu would exceed the compile-time limit %zu (already %zu bytes buffered) -- attempt to make space by freeing buffered future messages\n"
                                   ,local_38,0x8000,uVar16);
                        iVar4 = ssl_buffer_make_space(ssl,desired);
                        in_stack_ffffffffffffff60 = uVar16;
                        if (iVar4 == 0) goto LAB_00208d00;
                        mbedtls_debug_print_msg
                                  (ssl,2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                                   ,0x116d,
                                   "Reassembly of next message of size %zu (%zu with bitmap) would exceed the compile-time limit %zu (already %zu bytes buffered) -- fail\n"
                                   ,local_38,desired,0x8000,(pmVar1->buffering).total_bytes_buffered
                                  );
                        iVar4 = -0x6a00;
                      }
                      else {
LAB_00208d00:
                        mbedtls_debug_print_msg
                                  (ssl,2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                                   ,0x1176,"initialize reassembly, total length = %zu",local_38,
                                   in_stack_ffffffffffffff58);
                        piVar5 = (int *)calloc(1,desired);
                        local_40->data = (uchar *)piVar5;
                        if (piVar5 != (int *)0x0) {
                          local_40->data_len = desired;
                          piVar2 = (int *)ssl->in_msg;
                          *piVar5 = *piVar2;
                          *(short *)(piVar5 + 1) = (short)piVar2[1];
                          *(undefined2 *)((long)piVar5 + 6) = 0;
                          *(undefined1 *)(piVar5 + 2) = 0;
                          *(undefined2 *)((long)piVar5 + 9) = *(undefined2 *)((long)piVar5 + 1);
                          *(undefined1 *)((long)piVar5 + 0xb) = *(undefined1 *)((long)piVar5 + 3);
                          bVar18 = *(byte *)local_40 | 1;
                          *(byte *)local_40 = bVar18;
                          (pmVar1->buffering).total_bytes_buffered =
                               (pmVar1->buffering).total_bytes_buffered + desired;
                          pmVar12 = local_40;
                          goto LAB_00209280;
                        }
                        iVar4 = -0x7f00;
                      }
                      pcVar15 = "<= ssl_buffer_message";
                      iVar9 = 0x11ba;
                      goto LAB_002087fe;
                    }
                  }
                  else {
                    piVar5 = (int *)pmVar12->data;
                    if (*piVar5 == *(int *)ssl->in_msg) {
LAB_00209280:
                      if ((bVar18 & 4) == 0) {
                        puVar6 = ssl->in_msg;
                        uVar16 = (ulong)puVar6[8] |
                                 (ulong)((uint)puVar6[7] << 8 | (uint)puVar6[6] << 0x10);
                        pcVar15 = (char *)((ulong)puVar6[0xb] |
                                          (ulong)((uint)puVar6[10] << 8 | (uint)puVar6[9] << 0x10));
                        in_stack_ffffffffffffff58 = pcVar15;
                        local_40 = pmVar12;
                        mbedtls_debug_print_msg
                                  (ssl,2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                                   ,0x11a0,"adding fragment, offset = %zu, length = %zu",uVar16,
                                   pcVar15);
                        memcpy((void *)((long)piVar5 + uVar16 + 0xc),ssl->in_msg + 0xc,
                               (size_t)pcVar15);
                        if ((*(byte *)local_40 & 2) == 0) {
                          bVar18 = *(byte *)local_40 | 4;
                          uVar16 = in_stack_ffffffffffffff60;
                        }
                        else {
                          ssl_bitmask_set((uchar *)((long)piVar5 + uVar17),uVar16,(size_t)pcVar15);
                          iVar4 = ssl_bitmask_check((uchar *)((long)piVar5 + uVar17),
                                                    (size_t)local_38);
                          bVar18 = *(byte *)local_40 & 0xfb | (iVar4 == 0) << 2;
                          uVar16 = in_stack_ffffffffffffff60;
                        }
                        *(byte *)local_40 = bVar18;
                        pcVar15 = anon_var_dwarf_66ec33 + 9;
                        if ((bVar18 & 4) == 0) {
                          pcVar15 = "not yet ";
                        }
                        iVar4 = 0x11ad;
                        format = "message %scomplete";
LAB_002095c4:
                        mbedtls_debug_print_msg
                                  (ssl,2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                                   ,iVar4,format,pcVar15,in_stack_ffffffffffffff58);
                        in_stack_ffffffffffffff60 = uVar16;
                      }
                    }
                    else {
                      mbedtls_debug_print_msg
                                (ssl,1,
                                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                                 ,0x118b,"Fragment header mismatch - ignore");
                    }
                  }
                }
                else {
                  in_stack_ffffffffffffff60 =
                       CONCAT44((int)(in_stack_ffffffffffffff60 >> 0x20),uVar11 + 3);
                  in_stack_ffffffffffffff58 = (char *)CONCAT44(uVar22,uVar11);
                  mbedtls_debug_print_msg
                            (ssl,2,
                             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                             ,0x1120,
                             "Ignore future HS message with sequence number %u, buffering window %u - %u"
                             ,(ulong)(uint)uVar8,in_stack_ffffffffffffff58,in_stack_ffffffffffffff60
                            );
                }
              }
              else if (ssl->in_msgtype == 0x14) {
                mbedtls_debug_print_msg
                          (ssl,2,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                           ,0x1105,"Remember CCS message");
                (pmVar1->buffering).seen_ccs = '\x01';
              }
              iVar9 = 2;
              iVar4 = 0x11ba;
              pcVar15 = "<= ssl_buffer_message";
              goto LAB_002095e2;
            }
            goto LAB_00208815;
          }
          if (iVar4 == 0) {
            if (((update_hs_digest != 1) || (ssl->in_msgtype != 0x16)) ||
               (iVar4 = mbedtls_ssl_update_handshake_status(ssl), iVar4 == 0)) goto LAB_002087e0;
            pcVar15 = "mbedtls_ssl_update_handshake_status";
            iVar9 = 0x1059;
            goto LAB_00209741;
          }
        }
        pcVar15 = "mbedtls_ssl_handle_message_type";
        iVar9 = 0x1051;
        goto LAB_00209741;
      }
      if (ssl->in_offt != (uchar *)0x0) goto LAB_002088ab;
      ssl->in_msglen = 0;
LAB_002088ea:
      if (((ssl->conf->transport == '\x01') && (ssl->in_left <= ssl->next_record_offset)) &&
         (pmVar1 = ssl->handshake, pmVar1 != (mbedtls_ssl_handshake_params *)0x0)) {
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                   ,0x107d,"=> ssl_load_buffered_message");
        if ((ssl->state == 10) || (ssl->state == 0xc)) {
          if ((pmVar1->buffering).seen_ccs != '\0') {
            mbedtls_debug_print_msg
                      (ssl,2,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                       ,0x1089,"Injecting buffered CCS message");
            ssl->in_msgtype = 0x14;
            ssl->in_msglen = 1;
            *ssl->in_msg = '\x01';
            ssl->in_left = 0;
            ssl->next_record_offset = 0;
            (pmVar1->buffering).seen_ccs = '\0';
LAB_002089ac:
            mbedtls_debug_print_msg
                      (ssl,2,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                       ,0x10c9,"<= ssl_load_buffered_message");
            goto LAB_002088b5;
          }
          mbedtls_debug_print_msg
                    (ssl,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                     ,0x1084,"CCS not seen in the current flight");
LAB_00208de8:
          iVar9 = 2;
          iVar4 = 0x10c9;
          pcVar15 = "<= ssl_load_buffered_message";
        }
        else {
          iVar4 = 1;
          lVar20 = 0;
          do {
            bVar18 = (&(pmVar1->buffering).hs[1].field_0x0)[lVar20];
            if ((bVar18 & 1) != 0) {
              in_stack_ffffffffffffff58 = "fully";
              if ((bVar18 & 4) == 0) {
                in_stack_ffffffffffffff58 = "partially";
              }
              mbedtls_debug_print_msg
                        (ssl,2,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                         ,0x109f,"Future message with sequence number %u %s buffered.",
                         (ulong)(pmVar1->in_msg_seq + iVar4),in_stack_ffffffffffffff58);
            }
            lVar20 = lVar20 + 0x18;
            iVar4 = iVar4 + 1;
          } while (lVar20 != 0x48);
          if ((~*(byte *)(pmVar1->buffering).hs & 5) != 0) {
            mbedtls_debug_print_msg
                      (ssl,2,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                       ,0x10c2,"Next handshake message %u not or only partially bufffered",
                       (ulong)pmVar1->in_msg_seq);
            goto LAB_00208de8;
          }
          puVar6 = (pmVar1->buffering).hs[0].data;
          uVar17 = (ulong)puVar6[3] | (ulong)((uint)puVar6[2] << 8 | (uint)puVar6[1] << 0x10);
          if (uVar17 < 0x3f5) {
            pcVar15 = (char *)(uVar17 + 0xc);
            mbedtls_debug_print_msg
                      (ssl,2,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                       ,0x10b5,"Next handshake message has been buffered - load");
            in_stack_ffffffffffffff58 = pcVar15;
            mbedtls_debug_print_buf
                      (ssl,3,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                       ,0x10b7,"Buffered handshake message (incl. header)",
                       (pmVar1->buffering).hs[0].data,(size_t)pcVar15);
            ssl->in_msgtype = 0x16;
            ssl->in_hslen = (size_t)pcVar15;
            ssl->in_msglen = (size_t)pcVar15;
            memcpy(ssl->in_msg,(pmVar1->buffering).hs[0].data,(size_t)pcVar15);
            goto LAB_002089ac;
          }
          iVar9 = 1;
          iVar4 = 0x10b1;
          pcVar15 = "should never happen";
        }
        mbedtls_debug_print_msg
                  (ssl,iVar9,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                   ,iVar4,pcVar15);
      }
      pmVar1 = ssl->handshake;
      uVar7 = ssl->conf->transport;
      if (pmVar1 == (mbedtls_ssl_handshake_params *)0x0 || uVar7 != '\x01') {
LAB_00208f26:
        sVar14 = 5;
        if (uVar7 == '\x01') goto LAB_00208f30;
      }
      else {
        puVar6 = (pmVar1->buffering).future_record.data;
        if ((puVar6 != (uchar *)0x0) && (ssl->in_left <= ssl->next_record_offset)) {
          __n = (uchar *)(pmVar1->buffering).future_record.len;
          uVar11 = (pmVar1->buffering).future_record.epoch;
          mbedtls_debug_print_msg
                    (ssl,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                     ,0x124e,"=> ssl_load_buffered_record");
          if (uVar11 == ssl->in_epoch) {
            mbedtls_debug_print_msg
                      (ssl,2,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                       ,0x1255,"Found buffered record from current epoch - load");
            if (ssl->in_buf + (0x42d - (long)ssl->in_hdr) < __n) {
              mbedtls_debug_print_msg
                        (ssl,1,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                         ,0x1259,"should never happen");
              iVar4 = -0x6c00;
              break;
            }
            memcpy(ssl->in_hdr,puVar6,(size_t)__n);
            ssl->in_left = (size_t)__n;
            ssl->next_record_offset = 0;
            ssl_free_buffered_record((mbedtls_ssl_context *)ssl->handshake);
          }
          else {
            mbedtls_debug_print_msg
                      (ssl,2,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                       ,0x1251,"Buffered record not from current epoch.");
          }
          mbedtls_debug_print_msg
                    (ssl,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                     ,0x1264,"<= ssl_load_buffered_record");
          uVar7 = ssl->conf->transport;
          goto LAB_00208f26;
        }
LAB_00208f30:
        sVar14 = 0xd;
      }
      iVar4 = mbedtls_ssl_fetch_input(ssl,sVar14);
      if (iVar4 == 0) {
        iVar4 = ssl_parse_record_header(ssl,ssl->in_hdr,ssl->in_left,&local_70);
        uVar7 = ssl->conf->transport;
        if (iVar4 == 0) {
          if (uVar7 == '\x01') {
            ssl->next_record_offset = local_70.buf_len;
            if (local_70.buf_len < (char *)ssl->in_left) {
              mbedtls_debug_print_msg
                        (ssl,3,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                         ,0x1300,"more than one record within datagram");
            }
          }
          else {
            iVar4 = mbedtls_ssl_fetch_input(ssl,local_70.buf_len);
            if (iVar4 != 0) {
              iVar9 = 0x130a;
              goto LAB_00208f5b;
            }
            ssl->in_left = 0;
          }
          in_stack_ffffffffffffff58 = (char *)local_70.buf_len;
          mbedtls_debug_print_buf
                    (ssl,4,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                     ,0xf89,"input record from network",local_70.buf,local_70.buf_len);
          uVar7 = local_70.type;
          if (ssl->transform_in == (mbedtls_ssl_transform *)0x0) {
            uVar7 = ssl->conf->transport;
LAB_002091be:
            if (uVar7 == '\x01') {
LAB_0020939e:
              mbedtls_ssl_dtls_replay_update(ssl);
            }
            if (local_70.data_len < (char *)0x401) {
              pbVar3 = ssl->in_hdr;
              bVar21 = ssl->conf->transport == '\x01';
              pbVar13 = pbVar3 + -8;
              if (bVar21) {
                pbVar13 = pbVar3 + 3;
              }
              uVar17 = (ulong)bVar21;
              ssl->in_ctr = pbVar13;
              ssl->in_len = pbVar3 + uVar17 * 8 + 3;
              ssl->in_iv = pbVar3 + uVar17 * 8 + 5;
              ssl->in_msgtype = (uint)local_70.type;
              *pbVar3 = local_70.type;
              ssl->in_msg = local_70.buf + local_70.data_offset;
              ssl->in_msglen = local_70.data_len;
              *(ushort *)ssl->in_len =
                   (ushort)local_70.data_len << 8 | (ushort)local_70.data_len >> 8;
              goto LAB_002088b5;
            }
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                       ,0xffe,"bad message length");
          }
          else {
            uVar17 = (ulong)local_70.type;
            iVar4 = mbedtls_ssl_decrypt_buf(ssl,ssl->transform_in,&local_70);
            if (iVar4 != 0) {
              mbedtls_debug_print_ret
                        (ssl,1,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                         ,0xf9e,"ssl_decrypt_buf",iVar4);
LAB_00209143:
              if ((iVar4 != -0x7180) || (ssl->conf->transport != '\x01')) goto LAB_00208f6a;
              if ((ssl->state != 0xb) && (ssl->state != 0xd)) {
                uVar11 = ssl->conf->badmac_limit;
                if ((uVar11 == 0) ||
                   (uVar10 = ssl->badmac_seen + 1, ssl->badmac_seen = uVar10, uVar10 < uVar11)) {
                  ssl->next_record_offset = 0;
                  ssl->in_left = 0;
                  iVar9 = 1;
                  iVar4 = 0x1335;
                  pcVar15 = "discarding invalid record (mac)";
                  goto LAB_002095e2;
                }
                mbedtls_debug_print_msg
                          (ssl,1,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                           ,0x132b,"too many records with bad MAC");
              }
              iVar4 = -0x7180;
              break;
            }
            if (uVar7 != local_70.type) {
              mbedtls_debug_print_msg
                        (ssl,4,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                         ,0xfae,"record type after decrypt (before %d): %d",uVar17,
                         CONCAT44((int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                                  (uint)local_70.type));
            }
            in_stack_ffffffffffffff58 = (char *)local_70.data_len;
            mbedtls_debug_print_buf
                      (ssl,4,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                       ,0xfb2,"input payload after decrypt",local_70.buf + local_70.data_offset,
                       local_70.data_len);
            if ((char *)local_70.data_len != (char *)0x0) {
              ssl->nb_zero = 0;
LAB_00209391:
              if (ssl->conf->transport == '\x01') goto LAB_0020939e;
              uVar11 = 7;
              do {
                uVar10 = uVar11 + 1;
                uVar7 = ssl->conf->transport;
                if (uVar10 <= (uint)(uVar7 == '\x01') * 2) goto LAB_0020945f;
                uVar17 = (ulong)uVar11;
                uVar11 = uVar11 - 1;
                puVar6 = ssl->in_ctr + uVar17;
                *puVar6 = *puVar6 + '\x01';
              } while (*puVar6 == '\0');
              uVar7 = ssl->conf->transport;
LAB_0020945f:
              if ((uint)(uVar7 == '\x01') * 2 != uVar10) goto LAB_002091be;
              mbedtls_debug_print_msg
                        (ssl,1,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                         ,0xfee,"incoming message counter would wrap");
              iVar4 = -0x6b80;
              break;
            }
            if ((ssl->tls_version != MBEDTLS_SSL_VERSION_TLS1_2) || (local_70.type == 0x17)) {
              iVar4 = ssl->nb_zero;
              ssl->nb_zero = iVar4 + 1;
              if (2 < iVar4) {
                mbedtls_debug_print_msg
                          (ssl,1,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                           ,0xfd4,"received four consecutive empty messages, possible DoS attack");
                iVar4 = -0x7180;
                goto LAB_00209143;
              }
              goto LAB_00209391;
            }
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                       ,0xfc7,"invalid zero-length message type: %d",(ulong)(uint)ssl->in_msgtype);
          }
          iVar4 = -0x7200;
          break;
        }
        if (uVar7 != '\x01') goto LAB_00208f6a;
        if (iVar4 != -0x6700) {
          if (iVar4 != -0x6480) {
            ssl->next_record_offset = 0;
            ssl->in_left = 0;
            iVar9 = 1;
            iVar4 = 0x12ef;
            pcVar15 = "discarding invalid record (header)";
            goto LAB_002095e2;
          }
          pmVar1 = ssl->handshake;
          if (((pmVar1 != (mbedtls_ssl_handshake_params *)0x0) && (local_70.type == 0x16)) &&
             ((pmVar1->buffering).future_record.data == (uchar *)0x0)) {
            uVar17 = (pmVar1->buffering).total_bytes_buffered;
            if ((char *)(0x8000 - uVar17) < local_70.buf_len) {
              in_stack_ffffffffffffff58 = (char *)0x0;
              mbedtls_debug_print_msg
                        (ssl,2,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                         ,0x1286,
                         "Buffering of future epoch record of size %zu would exceed the compile-time limit %zu (already %zu bytes buffered) -- ignore\n"
                         ,local_70.buf_len,0x8000,uVar17);
              in_stack_ffffffffffffff60 = uVar17;
            }
            else {
              mbedtls_debug_print_msg
                        (ssl,2,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                         ,0x128c,"Buffer record from epoch %u",(ulong)(ssl->in_epoch + 1));
              in_stack_ffffffffffffff58 = (char *)local_70.buf_len;
              mbedtls_debug_print_buf
                        (ssl,3,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                         ,0x128d,"Buffered record",local_70.buf,local_70.buf_len);
              sVar14 = local_70.buf_len;
              (pmVar1->buffering).future_record.epoch = ssl->in_epoch + 1;
              (pmVar1->buffering).future_record.len = local_70.buf_len;
              puVar6 = (uchar *)calloc(1,local_70.buf_len);
              (pmVar1->buffering).future_record.data = puVar6;
              if (puVar6 != (uchar *)0x0) {
                memcpy(puVar6,local_70.buf,sVar14);
                (pmVar1->buffering).total_bytes_buffered =
                     (size_t)(sVar14 + (pmVar1->buffering).total_bytes_buffered);
              }
            }
          }
        }
        ssl->next_record_offset = local_70.buf_len;
        iVar9 = 1;
        iVar4 = 0x12e8;
        pcVar15 = "discarding unexpected record (header)";
LAB_002095e2:
        mbedtls_debug_print_msg
                  (ssl,iVar9,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                   ,iVar4,pcVar15);
        goto LAB_00208815;
      }
      iVar9 = 0x12bc;
LAB_00208f5b:
      mbedtls_debug_print_ret
                (ssl,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                 ,iVar9,"mbedtls_ssl_fetch_input",iVar4);
LAB_00208f6a:
    } while (iVar4 == -0x6580);
    pcVar15 = "ssl_get_next_record";
    iVar9 = 0x1039;
LAB_00209741:
    mbedtls_debug_print_ret
              (ssl,1,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
               ,iVar9,pcVar15,iVar4);
  }
  else {
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
               ,0x105e,"reuse previously read message");
    ssl->keep_current_message = 0;
LAB_002087e0:
    pcVar15 = "<= read record";
    iVar4 = 0;
    iVar9 = 0x1062;
LAB_002087fe:
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
               ,iVar9,pcVar15);
  }
  return iVar4;
}

Assistant:

int mbedtls_ssl_read_record(mbedtls_ssl_context *ssl,
                            unsigned update_hs_digest)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    MBEDTLS_SSL_DEBUG_MSG(2, ("=> read record"));

    if (ssl->keep_current_message == 0) {
        do {

            ret = ssl_consume_current_message(ssl);
            if (ret != 0) {
                return ret;
            }

            if (ssl_record_is_in_progress(ssl) == 0) {
                int dtls_have_buffered = 0;
#if defined(MBEDTLS_SSL_PROTO_DTLS)

                /* We only check for buffered messages if the
                 * current datagram is fully consumed. */
                if (ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
                    ssl_next_record_is_in_datagram(ssl) == 0) {
                    if (ssl_load_buffered_message(ssl) == 0) {
                        dtls_have_buffered = 1;
                    }
                }

#endif /* MBEDTLS_SSL_PROTO_DTLS */
                if (dtls_have_buffered == 0) {
                    ret = ssl_get_next_record(ssl);
                    if (ret == MBEDTLS_ERR_SSL_CONTINUE_PROCESSING) {
                        continue;
                    }

                    if (ret != 0) {
                        MBEDTLS_SSL_DEBUG_RET(1, ("ssl_get_next_record"), ret);
                        return ret;
                    }
                }
            }

            ret = mbedtls_ssl_handle_message_type(ssl);

#if defined(MBEDTLS_SSL_PROTO_DTLS)
            if (ret == MBEDTLS_ERR_SSL_EARLY_MESSAGE) {
                /* Buffer future message */
                ret = ssl_buffer_message(ssl);
                if (ret != 0) {
                    return ret;
                }

                ret = MBEDTLS_ERR_SSL_CONTINUE_PROCESSING;
            }
#endif /* MBEDTLS_SSL_PROTO_DTLS */

        } while (MBEDTLS_ERR_SSL_NON_FATAL           == ret  ||
                 MBEDTLS_ERR_SSL_CONTINUE_PROCESSING == ret);

        if (0 != ret) {
            MBEDTLS_SSL_DEBUG_RET(1, ("mbedtls_ssl_handle_message_type"), ret);
            return ret;
        }

        if (ssl->in_msgtype == MBEDTLS_SSL_MSG_HANDSHAKE &&
            update_hs_digest == 1) {
            ret = mbedtls_ssl_update_handshake_status(ssl);
            if (0 != ret) {
                MBEDTLS_SSL_DEBUG_RET(1, ("mbedtls_ssl_update_handshake_status"), ret);
                return ret;
            }
        }
    } else {
        MBEDTLS_SSL_DEBUG_MSG(2, ("reuse previously read message"));
        ssl->keep_current_message = 0;
    }

    MBEDTLS_SSL_DEBUG_MSG(2, ("<= read record"));

    return 0;
}